

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_inflateReset(lzham_z_streamp pStream)

{
  lzham_decompress_state_ptr pvVar1;
  long in_RDI;
  lzham_decompress_params params;
  lzham_decompressor *pDecomp;
  lzham_decompress_state_ptr pState;
  undefined1 auStackY_48 [24];
  lzham_decompress_params *in_stack_ffffffffffffffd0;
  lzham_decompress_state_ptr in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x38) == 0)) {
    local_4 = -2;
  }
  else {
    memcpy(auStackY_48,(void *)(*(long *)(in_RDI + 0x38) + 0x138),0x28);
    pvVar1 = lzham_lib_decompress_reinit(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (pvVar1 == (lzham_decompress_state_ptr)0x0) {
      local_4 = -2;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int LZHAM_CDECL lzham_lib_z_inflateReset(lzham_z_streamp pStream)
   {
      if ((!pStream) || (!pStream->state)) 
         return LZHAM_Z_STREAM_ERROR;

      lzham_decompress_state_ptr pState = static_cast<lzham_decompress_state_ptr>(pStream->state);
      lzham_decompressor *pDecomp = static_cast<lzham_decompressor *>(pState);
      
      lzham_decompress_params params(pDecomp->m_params);

      if (!lzham_lib_decompress_reinit(pState, &params))
         return LZHAM_Z_STREAM_ERROR;

      return LZHAM_Z_OK;
   }